

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

uint32_t phf_g<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k,
                   uint32_t seed)

{
  uint *puVar1;
  uint in_EDX;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long in_RSI;
  undefined4 in_register_0000003c;
  uint *local_40;
  long local_38;
  uint local_30 [4];
  
  uVar4 = (ulong)in_EDX;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,CONCAT44(in_register_0000003c,seed),
             in_RSI + CONCAT44(in_register_0000003c,seed));
  puVar1 = local_40;
  do {
    uVar3 = 0;
    uVar2 = 0;
    switch(local_38) {
    case 3:
      uVar2 = (uint)*(byte *)((long)puVar1 + 2) << 8;
    case 2:
      uVar3 = uVar2 | (uint)*(byte *)((long)puVar1 + 1) << 0x10;
    case 1:
      uVar2 = (((uint)(byte)*puVar1 << 0x18 | uVar3) * -0x3361d2af >> 0x11 | uVar3 * 0x16a88000) *
              0x1b873593 ^ (uint)uVar4;
      uVar4 = (ulong)((uVar2 << 0xd | uVar2 >> 0x13) * 5 + 0xe6546b64);
    case 0:
      if (local_40 != local_30) {
        operator_delete(local_40);
      }
      uVar2 = ((uint)(uVar4 >> 0x10) ^ (uint)uVar4) * -0x7a143595;
      uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
      return uVar2 >> 0x10 ^ uVar2;
    default:
      uVar2 = *puVar1;
      uVar3 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8;
      uVar2 = ((uVar3 | uVar2 << 0x18) * -0x3361d2af >> 0x11 | uVar3 * 0x16a88000) * 0x1b873593 ^
              (uint)uVar4;
      uVar4 = (ulong)((uVar2 << 0xd | uVar2 >> 0x13) * 5 + 0xe6546b64);
      puVar1 = puVar1 + 1;
      local_38 = local_38 + -4;
    }
  } while( true );
}

Assistant:

static inline uint32_t phf_g(T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}